

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O3

int Cbs_ManAnalyze(Cbs_Man_t *p,int Level,Gia_Obj_t *pVar,Gia_Obj_t *pFan0,Gia_Obj_t *pFan1)

{
  Gia_Obj_t **ppGVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  
  if ((pVar->field_0x3 & 0x40) == 0) {
    __assert_fail("Cbs_VarIsAssigned(pVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x29b,
                  "int Cbs_ManAnalyze(Cbs_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if ((pFan0->field_0x3 & 0x40) == 0) {
    __assert_fail("Cbs_VarIsAssigned(pFan0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x29c,
                  "int Cbs_ManAnalyze(Cbs_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if ((pFan1 != (Gia_Obj_t *)0x0) && ((pFan1->field_0x3 & 0x40) == 0)) {
    __assert_fail("pFan1 == NULL || Cbs_VarIsAssigned(pFan1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x29d,
                  "int Cbs_ManAnalyze(Cbs_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar4 = (p->pClauses).iHead;
  if (iVar4 != (p->pClauses).iTail) {
    __assert_fail("Cbs_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x29e,
                  "int Cbs_ManAnalyze(Cbs_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if (iVar4 == (p->pClauses).nSize) {
    (p->pClauses).nSize = iVar4 * 2;
    ppGVar1 = (p->pClauses).pData;
    if (ppGVar1 == (Gia_Obj_t **)0x0) {
      ppGVar1 = (Gia_Obj_t **)malloc((long)iVar4 << 4);
    }
    else {
      ppGVar1 = (Gia_Obj_t **)realloc(ppGVar1,(long)iVar4 << 4);
      iVar4 = (p->pClauses).iTail;
    }
    (p->pClauses).pData = ppGVar1;
  }
  else {
    ppGVar1 = (p->pClauses).pData;
  }
  iVar2 = iVar4 + 1;
  (p->pClauses).iTail = iVar2;
  ppGVar1[iVar4] = (Gia_Obj_t *)0x0;
  if (((ulong)pVar & 1) == 0) {
    if (iVar2 == (p->pClauses).nSize) {
      (p->pClauses).nSize = iVar2 * 2;
      ppGVar1 = (p->pClauses).pData;
      sVar3 = (long)(iVar2 * 2) << 3;
      if (ppGVar1 == (Gia_Obj_t **)0x0) {
        ppGVar1 = (Gia_Obj_t **)malloc(sVar3);
      }
      else {
        ppGVar1 = (Gia_Obj_t **)realloc(ppGVar1,sVar3);
        iVar2 = (p->pClauses).iTail;
      }
      (p->pClauses).pData = ppGVar1;
    }
    else {
      ppGVar1 = (p->pClauses).pData;
    }
    iVar4 = iVar2 + 1;
    (p->pClauses).iTail = iVar4;
    ppGVar1[iVar2] = pVar;
    if (((ulong)pFan0 & 1) == 0) {
      if (iVar4 == (p->pClauses).nSize) {
        (p->pClauses).nSize = iVar4 * 2;
        ppGVar1 = (p->pClauses).pData;
        sVar3 = (long)(iVar4 * 2) << 3;
        if (ppGVar1 == (Gia_Obj_t **)0x0) {
          ppGVar1 = (Gia_Obj_t **)malloc(sVar3);
        }
        else {
          ppGVar1 = (Gia_Obj_t **)realloc(ppGVar1,sVar3);
          iVar4 = (p->pClauses).iTail;
        }
        (p->pClauses).pData = ppGVar1;
      }
      else {
        ppGVar1 = (p->pClauses).pData;
      }
      iVar2 = iVar4 + 1;
      (p->pClauses).iTail = iVar2;
      ppGVar1[iVar4] = pFan0;
      if (pFan1 != (Gia_Obj_t *)0x0) {
        if (((ulong)pFan1 & 1) != 0) goto LAB_0071dfe4;
        if (iVar2 == (p->pClauses).nSize) {
          (p->pClauses).nSize = iVar2 * 2;
          ppGVar1 = (p->pClauses).pData;
          sVar3 = (long)(iVar2 * 2) << 3;
          if (ppGVar1 == (Gia_Obj_t **)0x0) {
            ppGVar1 = (Gia_Obj_t **)malloc(sVar3);
          }
          else {
            ppGVar1 = (Gia_Obj_t **)realloc(ppGVar1,sVar3);
            iVar2 = (p->pClauses).iTail;
          }
          (p->pClauses).pData = ppGVar1;
        }
        else {
          ppGVar1 = (p->pClauses).pData;
        }
        (p->pClauses).iTail = iVar2 + 1;
        ppGVar1[iVar2] = pFan1;
      }
      Cbs_ManDeriveReason(p,Level);
      iVar4 = (p->pClauses).iHead;
      iVar2 = (p->pClauses).iTail;
      if (iVar4 < iVar2) {
        if (iVar2 == (p->pClauses).nSize) {
          (p->pClauses).nSize = iVar2 * 2;
          ppGVar1 = (p->pClauses).pData;
          if (ppGVar1 == (Gia_Obj_t **)0x0) {
            ppGVar1 = (Gia_Obj_t **)malloc((long)iVar2 << 4);
          }
          else {
            ppGVar1 = (Gia_Obj_t **)realloc(ppGVar1,(long)iVar2 << 4);
            iVar2 = (p->pClauses).iTail;
          }
          (p->pClauses).pData = ppGVar1;
        }
        else {
          ppGVar1 = (p->pClauses).pData;
        }
        (p->pClauses).iTail = iVar2 + 1;
        ppGVar1[iVar2] = (Gia_Obj_t *)0x0;
        (p->pClauses).iHead = iVar2 + 1;
        return iVar4;
      }
      __assert_fail("p->iHead < p->iTail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                    ,0x172,"int Cbs_QueFinish(Cbs_Que_t *)");
    }
  }
LAB_0071dfe4:
  __assert_fail("!Gia_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                ,0x120,"void Cbs_QuePush(Cbs_Que_t *, Gia_Obj_t *)");
}

Assistant:

static inline int Cbs_ManAnalyze( Cbs_Man_t * p, int Level, Gia_Obj_t * pVar, Gia_Obj_t * pFan0, Gia_Obj_t * pFan1 )
{
    Cbs_Que_t * pQue = &(p->pClauses);
    assert( Cbs_VarIsAssigned(pVar) );
    assert( Cbs_VarIsAssigned(pFan0) );
    assert( pFan1 == NULL || Cbs_VarIsAssigned(pFan1) );
    assert( Cbs_QueIsEmpty( pQue ) );
    Cbs_QuePush( pQue, NULL );
    Cbs_QuePush( pQue, pVar );
    Cbs_QuePush( pQue, pFan0 );
    if ( pFan1 )
        Cbs_QuePush( pQue, pFan1 );
    Cbs_ManDeriveReason( p, Level );
    return Cbs_QueFinish( pQue );
}